

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5Bm25Function(Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
                     sqlite3_value **apVal)

{
  u64 n;
  double dVar1;
  bool bVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  uint *__s;
  long lVar7;
  void *__s_00;
  int iVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  int nInst;
  int io;
  sqlite3_int64 nToken;
  sqlite3_int64 nRow;
  int local_54;
  long local_50;
  sqlite3_int64 local_48;
  sqlite3_int64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_54 = 0;
  iVar5 = 0;
  puVar6 = (uint *)(*pApi->xGetAuxdata)(pFts,0);
  if (puVar6 == (uint *)0x0) {
    __s = (uint *)0x0;
    local_40 = 0;
    local_48 = 0;
    uVar4 = (*pApi->xPhraseCount)(pFts);
    n = (long)(int)(uVar4 * 2) * 8 + 0x20;
    iVar5 = sqlite3_initialize();
    if (iVar5 == 0) {
      __s = (uint *)sqlite3Malloc(n);
    }
    if (__s == (uint *)0x0) {
      iVar5 = 7;
    }
    else {
      memset(__s,0,n);
      *__s = uVar4;
      *(uint **)(__s + 4) = __s + 8;
      *(uint **)(__s + 6) = __s + (long)(int)uVar4 * 2 + 8;
      iVar5 = (*pApi->xRowCount)(pFts,&local_40);
    }
    if (iVar5 == 0) {
      iVar5 = (*pApi->xColumnTotalSize)(pFts,-1,&local_48);
    }
    bVar10 = iVar5 == 0;
    if (bVar10) {
      *(double *)(__s + 2) = (double)local_48 / (double)local_40;
    }
    if (0 < (int)uVar4 && iVar5 == 0) {
      uVar9 = 0;
      do {
        local_50 = 0;
        iVar5 = (*pApi->xQueryPhrase)(pFts,(int)uVar9,&local_50,fts5CountCb);
        bVar10 = iVar5 == 0;
        if (!bVar10) break;
        dVar13 = log(((double)(local_40 - local_50) + 0.5) / ((double)local_50 + 0.5));
        *(ulong *)(*(long *)(__s + 4) + uVar9 * 8) =
             ~-(ulong)(0.0 < dVar13) & 0x3eb0c6f7a0b5ed8d | (ulong)dVar13 & -(ulong)(0.0 < dVar13);
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar4);
    }
    if (bVar10) {
      iVar5 = (*pApi->xSetAuxdata)(pFts,__s,sqlite3_free);
    }
    else {
      sqlite3_free(__s);
    }
    puVar6 = (uint *)0x0;
    if (iVar5 == 0) {
      puVar6 = __s;
    }
  }
  if (iVar5 == 0) {
    __s_00 = *(void **)(puVar6 + 6);
    memset(__s_00,0,(long)(int)*puVar6 << 3);
    iVar5 = (*pApi->xInstCount)(pFts,&local_54);
  }
  else {
    __s_00 = (void *)0x0;
  }
  bVar10 = iVar5 == 0;
  if ((bVar10) && (0 < local_54)) {
    iVar8 = 1;
    do {
      local_40 = CONCAT44(local_40._4_4_,0xaaaaaaaa);
      local_48 = CONCAT44(local_48._4_4_,0xaaaaaaaa);
      local_50 = CONCAT44(local_50._4_4_,0xaaaaaaaa);
      iVar5 = (*pApi->xInst)(pFts,iVar8 + -1,(int *)&local_40,(int *)&local_48,(int *)&local_50);
      if (iVar5 == 0) {
        uVar11 = 0;
        uVar12 = 0x3ff00000;
        if ((int)local_48 < nVal) {
          dVar13 = sqlite3VdbeRealValue(apVal[(int)local_48]);
          uVar11 = SUB84(dVar13,0);
          uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
        }
        *(double *)((long)__s_00 + (long)(int)local_40 * 8) =
             (double)CONCAT44(uVar12,uVar11) + *(double *)((long)__s_00 + (long)(int)local_40 * 8);
      }
      bVar10 = iVar5 == 0;
    } while ((bVar10) && (bVar2 = iVar8 < local_54, iVar8 = iVar8 + 1, bVar2));
  }
  dVar13 = 0.0;
  if (bVar10) {
    local_40 = CONCAT44(local_40._4_4_,0xaaaaaaaa);
    iVar5 = (*pApi->xColumnSize)(pFts,-1,(int *)&local_40);
    dVar13 = (double)(int)local_40 * 0.75;
  }
  if (iVar5 == 0) {
    if ((long)(int)*puVar6 < 1) {
      dVar3 = 0.0;
    }
    else {
      dVar3 = 0.0;
      lVar7 = 0;
      do {
        dVar1 = *(double *)((long)__s_00 + lVar7 * 8);
        dVar3 = dVar3 + ((dVar1 * 2.2) / (dVar1 + (dVar13 / *(double *)(puVar6 + 2) + 0.25) * 1.2))
                        * *(double *)(*(long *)(puVar6 + 4) + lVar7 * 8);
        lVar7 = lVar7 + 1;
      } while ((int)*puVar6 != lVar7);
    }
    sqlite3VdbeMemSetDouble(pCtx->pOut,-dVar3);
  }
  else {
    sqlite3_result_error_code(pCtx,iVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts5Bm25Function(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  const double k1 = 1.2;          /* Constant "k1" from BM25 formula */
  const double b = 0.75;          /* Constant "b" from BM25 formula */
  int rc;                         /* Error code */
  double score = 0.0;             /* SQL function return value */
  Fts5Bm25Data *pData;            /* Values allocated/calculated once only */
  int i;                          /* Iterator variable */
  int nInst = 0;                  /* Value returned by xInstCount() */
  double D = 0.0;                 /* Total number of tokens in row */
  double *aFreq = 0;              /* Array of phrase freq. for current row */

  /* Calculate the phrase frequency (symbol "f(qi,D)" in the documentation)
  ** for each phrase in the query for the current row. */
  rc = fts5Bm25GetData(pApi, pFts, &pData);
  if( rc==SQLITE_OK ){
    aFreq = pData->aFreq;
    memset(aFreq, 0, sizeof(double) * pData->nPhrase);
    rc = pApi->xInstCount(pFts, &nInst);
  }
  for(i=0; rc==SQLITE_OK && i<nInst; i++){
    int ip; int ic; int io;
    rc = pApi->xInst(pFts, i, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      double w = (nVal > ic) ? sqlite3_value_double(apVal[ic]) : 1.0;
      aFreq[ip] += w;
    }
  }

  /* Figure out the total size of the current row in tokens. */
  if( rc==SQLITE_OK ){
    int nTok;
    rc = pApi->xColumnSize(pFts, -1, &nTok);
    D = (double)nTok;
  }

  /* Determine and return the BM25 score for the current row. Or, if an
  ** error has occurred, throw an exception. */
  if( rc==SQLITE_OK ){
    for(i=0; i<pData->nPhrase; i++){
      score += pData->aIDF[i] * (
          ( aFreq[i] * (k1 + 1.0) ) /
          ( aFreq[i] + k1 * (1 - b + b * D / pData->avgdl) )
      );
    }
    sqlite3_result_double(pCtx, -1.0 * score);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
}